

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apple_sysf.cpp
# Opt level: O2

void __thiscall
apple_sysf_t::sysf_store_body_t::sysf_store_body_t
          (sysf_store_body_t *this,kstream *p__io,apple_sysf_t *p__parent,apple_sysf_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__sysf_store_body_t_00180b88;
  (this->m_variables)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>
        *)0x0;
  (this->m_zeroes)._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
  _M_head_impl = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
           *)&this->m_variables,(pointer)0x0);
  std::
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)&this->m_zeroes,(pointer)0x0);
  _read(this);
  return;
}

Assistant:

apple_sysf_t::sysf_store_body_t::sysf_store_body_t(kaitai::kstream* p__io, apple_sysf_t* p__parent, apple_sysf_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_variables = nullptr;
    m_zeroes = nullptr;
    _read();
}